

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::MergePartialFromCodedStream
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 tag;
  KeyMapEntryAccessorType *value;
  ValueMapEntryAccessorType *value_00;
  uint32 first_byte_or_zero;
  
LAB_00576c4c:
  do {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      tag = (uint32)bVar1;
      first_byte_or_zero = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00576c67;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_00576c67:
      tag = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    if (tag == 10) {
      value = mutable_key(this);
      bVar4 = WireFormatLite::ReadBytes(input,value);
      if (!bVar4) {
        return false;
      }
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x12')) {
        input->buffer_ = puVar3 + 1;
LAB_00576cca:
        value_00 = mutable_value(this);
        bVar4 = WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CustomModel_CustomModelParamValue>
                          (input,value_00);
        if (!bVar4) {
          return false;
        }
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        bVar4 = io::CodedInputStream::ExpectAtEnd(input);
        if (bVar4) {
          return true;
        }
      }
      goto LAB_00576c4c;
    }
    if (tag == 0x12) goto LAB_00576cca;
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    bVar4 = WireFormatLite::SkipField(input,tag);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool MergePartialFromCodedStream(::google::protobuf::io::CodedInputStream* input) {
    uint32 tag;

    for (;;) {
      // 1) corrupted data: return false;
      // 2) unknown field: skip without putting into unknown field set;
      // 3) unknown enum value: keep it in parsing. In proto2, caller should
      // check the value and put this entry into containing message's unknown
      // field set if the value is an unknown enum. In proto3, caller doesn't
      // need to care whether the value is unknown enum;
      // 4) missing key/value: missed key/value will have default value. caller
      // should take this entry as if key/value is set to default value.
      tag = input->ReadTagNoLastTag();
      switch (tag) {
        case kKeyTag:
          if (!KeyTypeHandler::Read(input, mutable_key())) {
            return false;
          }
          set_has_key();
          if (!input->ExpectTag(kValueTag)) break;
          GOOGLE_FALLTHROUGH_INTENDED;

        case kValueTag:
          if (!ValueTypeHandler::Read(input, mutable_value())) {
            return false;
          }
          set_has_value();
          if (input->ExpectAtEnd()) return true;
          break;

        default:
          if (tag == 0 ||
              WireFormatLite::GetTagWireType(tag) ==
              WireFormatLite::WIRETYPE_END_GROUP) {
            return true;
          }
          if (!WireFormatLite::SkipField(input, tag)) return false;
          break;
      }
    }
  }